

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_token_tree.cpp
# Opt level: O1

idx_t __thiscall
duckdb::WindowTokenTree::PeerEnd(WindowTokenTree *this,idx_t lower,idx_t upper,idx_t row_idx)

{
  pointer puVar1;
  value_type vVar2;
  pointer puVar3;
  bool bVar4;
  type this_00;
  const_reference pvVar5;
  const_reference pvVar6;
  type this_01;
  const_reference pvVar7;
  const_reference pvVar8;
  unsigned_long uVar9;
  long lVar10;
  vector<unsigned_long,_true> *this_02;
  ulong uVar11;
  unsigned_long uVar12;
  vector<unsigned_int,_true> *this_03;
  ulong uVar13;
  ulong uVar14;
  idx_t run_begin;
  idx_t iVar15;
  ulong uVar16;
  size_type sVar17;
  size_type __n;
  size_type sVar18;
  ulong *puVar19;
  ulong *puVar20;
  uint *puVar21;
  uint *puVar22;
  uint uVar23;
  ulong uVar24;
  unsigned_long run_begin_1;
  ulong uVar25;
  ulong uVar26;
  idx_t iVar27;
  long lVar28;
  idx_t iVar29;
  ulong local_98;
  ulong local_88;
  size_type local_58;
  size_type local_48;
  
  local_98 = lower;
  if ((this->super_WindowMergeSortTree).mst64.
      super_unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      .
      super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_false>
      ._M_head_impl ==
      (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *)0x0) {
    this_01 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
              ::operator*(&(this->super_WindowMergeSortTree).mst32);
    pvVar7 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
             ::operator[](&this_01->tree,0);
    pvVar8 = vector<unsigned_int,_true>::operator[](&pvVar7->first,row_idx);
    if (lower < upper) {
      iVar27 = upper - 1;
      local_88 = 1;
      iVar15 = lower;
      if (iVar27 == lower) {
        uVar11 = 0;
        sVar17 = 0;
      }
      else {
        sVar17 = 0;
        do {
          uVar11 = iVar27;
          iVar15 = iVar15 >> 5;
          iVar27 = uVar11 >> 5;
          local_88 = local_88 * 0x20;
          sVar17 = sVar17 + 1;
        } while (iVar15 != iVar27);
        local_98 = local_88 * uVar11 >> 5;
      }
      uVar23 = *pvVar8 + 1;
      uVar14 = local_98;
      iVar29 = lower;
      if (2 < sVar17) {
        uVar25 = iVar15 * local_88;
        pvVar7 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this_01->tree,0);
        uVar24 = (long)(pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        if (uVar25 + local_88 <= uVar24) {
          uVar24 = uVar25 + local_88;
        }
        pvVar7 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this_01->tree,sVar17);
        puVar3 = (pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar22 = puVar3 + uVar25;
        uVar16 = uVar24 - uVar25;
        if (uVar16 != 0 && (long)uVar25 <= (long)uVar24) {
          do {
            uVar24 = uVar16 >> 1;
            uVar26 = ~uVar24 + uVar16;
            uVar16 = uVar24;
            if (puVar22[uVar24] < uVar23) {
              puVar22 = puVar22 + uVar24 + 1;
              uVar16 = uVar26;
            }
          } while (0 < (long)uVar16);
        }
        uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                          ((long)puVar22 - (long)puVar3 >> 2);
        lVar10 = (uVar25 / local_88) * 0x40;
        lVar28 = uVar11 + iVar27 * -0x20 + (uVar9 & 0xffffffffffffffe0);
        local_48 = lVar28 + lVar10;
        local_58 = (lVar10 + lVar28) - 0x20;
        uVar11 = sVar17;
        do {
          sVar17 = uVar11 - 1;
          local_88 = local_88 >> 5;
          pvVar7 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                   ::operator[](&this_01->tree,sVar17);
          puVar3 = (pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar7 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                   ::operator[](&this_01->tree,uVar11);
          this_03 = &pvVar7->second;
          local_58 = local_58 + 0x1f;
          uVar24 = local_98 - lower;
          while (local_88 <= uVar24) {
            pvVar8 = vector<unsigned_int,_true>::operator[](this_03,local_58);
            uVar25 = (ulong)*pvVar8;
            puVar22 = puVar3 + uVar25;
            pvVar8 = vector<unsigned_int,_true>::operator[](this_03,local_58 + 0x20);
            uVar24 = *pvVar8 - uVar25;
            if (uVar24 != 0 && uVar25 <= *pvVar8) {
              do {
                uVar25 = uVar24 >> 1;
                uVar16 = ~uVar25 + uVar24;
                uVar24 = uVar25;
                if (puVar22[uVar25] < uVar23) {
                  puVar22 = puVar22 + uVar25 + 1;
                  uVar24 = uVar16;
                }
              } while (0 < (long)uVar24);
            }
            local_98 = local_98 - local_88;
            uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar22 - (long)puVar3 >> 2);
            iVar29 = iVar29 + (uVar9 - local_98);
            local_58 = local_58 - 1;
            uVar24 = local_98 - lower;
          }
          if (local_98 != lower) {
            pvVar8 = vector<unsigned_int,_true>::operator[](this_03,local_58);
            uVar25 = (ulong)*pvVar8;
            puVar22 = puVar3 + uVar25;
            pvVar8 = vector<unsigned_int,_true>::operator[](this_03,local_58 + 0x20);
            uVar24 = *pvVar8 - uVar25;
            if (uVar24 != 0 && uVar25 <= *pvVar8) {
              do {
                uVar25 = uVar24 >> 1;
                uVar16 = ~uVar25 + uVar24;
                uVar24 = uVar25;
                if (puVar22[uVar25] < uVar23) {
                  puVar22 = puVar22 + uVar25 + 1;
                  uVar24 = uVar16;
                }
              } while (0 < (long)uVar24);
            }
            uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar22 - (long)puVar3 >> 2);
            local_58 = (lower / local_88) * 0x40 + (uVar9 & 0xffffffffffffffe0);
          }
          for (; local_88 <= upper - uVar14; uVar14 = uVar14 + local_88) {
            pvVar8 = vector<unsigned_int,_true>::operator[](this_03,local_48);
            uVar25 = (ulong)*pvVar8;
            puVar22 = puVar3 + uVar25;
            pvVar8 = vector<unsigned_int,_true>::operator[](this_03,local_48 + 0x20);
            uVar24 = *pvVar8 - uVar25;
            if (uVar24 != 0 && uVar25 <= *pvVar8) {
              do {
                uVar25 = uVar24 >> 1;
                uVar16 = ~uVar25 + uVar24;
                uVar24 = uVar25;
                if (puVar22[uVar25] < uVar23) {
                  puVar22 = puVar22 + uVar25 + 1;
                  uVar24 = uVar16;
                }
              } while (0 < (long)uVar24);
            }
            uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar22 - (long)puVar3 >> 2);
            iVar29 = iVar29 + (uVar9 - uVar14);
            local_48 = local_48 + 1;
          }
          if (uVar14 != upper) {
            pvVar8 = vector<unsigned_int,_true>::operator[](this_03,local_48);
            uVar25 = (ulong)*pvVar8;
            puVar22 = puVar3 + uVar25;
            pvVar8 = vector<unsigned_int,_true>::operator[](this_03,local_48 + 0x20);
            uVar24 = *pvVar8 - uVar25;
            if (uVar24 != 0 && uVar25 <= *pvVar8) {
              do {
                uVar25 = uVar24 >> 1;
                uVar16 = ~uVar25 + uVar24;
                uVar24 = uVar25;
                if (puVar22[uVar25] < uVar23) {
                  puVar22 = puVar22 + uVar25 + 1;
                  uVar24 = uVar16;
                }
              } while (0 < (long)uVar24);
            }
            uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar22 - (long)puVar3 >> 2);
            local_48 = (upper / local_88) * 0x40 + (uVar9 & 0xffffffffffffffe0);
          }
          bVar4 = 2 < uVar11;
          uVar11 = sVar17;
        } while (bVar4);
      }
      if (1 < sVar17) {
        sVar17 = sVar17 - 1;
        do {
          uVar24 = local_88 >> 5;
          pvVar7 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                   ::operator[](&this_01->tree,sVar17);
          puVar3 = (pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = local_98 - lower;
          while (uVar24 <= uVar11) {
            puVar22 = puVar3 + (local_98 - uVar24);
            uVar11 = uVar24;
            puVar21 = puVar22;
            if (0x1f < local_88) {
              do {
                uVar25 = uVar11 >> 1;
                if (puVar21[uVar25] < uVar23) {
                  puVar21 = puVar21 + uVar25 + 1;
                  uVar25 = ~uVar25 + uVar11;
                }
                uVar11 = uVar25;
              } while (0 < (long)uVar25);
            }
            uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar21 - (long)puVar3 >> 2);
            uVar12 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar22 - (long)puVar3 >> 2);
            iVar29 = iVar29 + (uVar9 - uVar12);
            local_98 = local_98 - uVar24;
            uVar11 = local_98 - lower;
          }
          for (; uVar24 <= upper - uVar14; uVar14 = uVar14 + uVar24) {
            puVar22 = puVar3 + uVar14;
            uVar11 = uVar24;
            do {
              uVar25 = uVar11 >> 1;
              uVar16 = ~uVar25 + uVar11;
              uVar11 = uVar25;
              if (puVar22[uVar25] < uVar23) {
                puVar22 = puVar22 + uVar25 + 1;
                uVar11 = uVar16;
              }
            } while (0 < (long)uVar11);
            uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar22 - (long)puVar3 >> 2);
            uVar12 = NumericCastImpl<unsigned_long,_long,_false>::Convert(uVar14);
            iVar29 = iVar29 + (uVar9 - uVar12);
          }
          sVar17 = sVar17 - 1;
          local_88 = uVar24;
        } while (sVar17 != 0);
      }
      pvVar7 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
               ::operator[](&this_01->tree,0);
      puVar3 = (pvVar7->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_98 != lower) {
        do {
          iVar29 = iVar29 + (puVar3[lower] < uVar23);
          lower = lower + 1;
        } while (local_98 != lower);
      }
      for (; lower = iVar29, uVar14 != upper; uVar14 = uVar14 + 1) {
        puVar22 = puVar3 + uVar14;
        iVar29 = lower + (*puVar22 < uVar23);
      }
    }
  }
  else {
    this_00 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
              ::operator*(&(this->super_WindowMergeSortTree).mst64);
    pvVar5 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
             ::operator[](&this_00->tree,0);
    pvVar6 = vector<unsigned_long,_true>::operator[](&pvVar5->first,row_idx);
    if (lower < upper) {
      iVar27 = upper - 1;
      local_88 = 1;
      iVar15 = lower;
      if (iVar27 == lower) {
        uVar11 = 0;
        sVar18 = 0;
      }
      else {
        sVar18 = 0;
        do {
          uVar11 = iVar27;
          iVar15 = iVar15 >> 5;
          iVar27 = uVar11 >> 5;
          local_88 = local_88 * 0x20;
          sVar18 = sVar18 + 1;
        } while (iVar15 != iVar27);
        local_98 = local_88 * uVar11 >> 5;
      }
      uVar24 = *pvVar6 + 1;
      uVar14 = local_98;
      iVar29 = lower;
      if (2 < sVar18) {
        uVar16 = iVar15 * local_88;
        pvVar5 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this_00->tree,0);
        uVar25 = (long)(pvVar5->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar5->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        if (uVar16 + local_88 <= uVar25) {
          uVar25 = uVar16 + local_88;
        }
        pvVar5 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this_00->tree,sVar18);
        puVar1 = (pvVar5->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar20 = puVar1 + uVar16;
        uVar26 = uVar25 - uVar16;
        if (uVar26 != 0 && (long)uVar16 <= (long)uVar25) {
          do {
            uVar25 = uVar26 >> 1;
            uVar13 = ~uVar25 + uVar26;
            uVar26 = uVar25;
            if (puVar20[uVar25] < uVar24) {
              puVar20 = puVar20 + uVar25 + 1;
              uVar26 = uVar13;
            }
          } while (0 < (long)uVar26);
        }
        uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                          ((long)puVar20 - (long)puVar1 >> 3);
        lVar10 = (uVar16 / local_88) * 0x40;
        lVar28 = uVar11 + iVar27 * -0x20 + (uVar9 & 0xffffffffffffffe0);
        __n = lVar28 + lVar10;
        local_58 = (lVar10 + lVar28) - 0x20;
        uVar11 = sVar18;
        do {
          sVar18 = uVar11 - 1;
          local_88 = local_88 >> 5;
          pvVar5 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                   ::operator[](&this_00->tree,sVar18);
          puVar1 = (pvVar5->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar5 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                   ::operator[](&this_00->tree,uVar11);
          this_02 = &pvVar5->second;
          local_58 = local_58 + 0x1f;
          uVar25 = local_98 - lower;
          while (local_88 <= uVar25) {
            pvVar6 = vector<unsigned_long,_true>::operator[](this_02,local_58);
            vVar2 = *pvVar6;
            puVar20 = puVar1 + vVar2;
            pvVar6 = vector<unsigned_long,_true>::operator[](this_02,local_58 + 0x20);
            uVar25 = *pvVar6 - vVar2;
            if (uVar25 != 0 && (long)vVar2 <= (long)*pvVar6) {
              do {
                uVar16 = uVar25 >> 1;
                uVar26 = ~uVar16 + uVar25;
                uVar25 = uVar16;
                if (puVar20[uVar16] < uVar24) {
                  puVar20 = puVar20 + uVar16 + 1;
                  uVar25 = uVar26;
                }
              } while (0 < (long)uVar25);
            }
            local_98 = local_98 - local_88;
            uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar20 - (long)puVar1 >> 3);
            iVar29 = iVar29 + (uVar9 - local_98);
            local_58 = local_58 - 1;
            uVar25 = local_98 - lower;
          }
          if (local_98 != lower) {
            pvVar6 = vector<unsigned_long,_true>::operator[](this_02,local_58);
            vVar2 = *pvVar6;
            puVar20 = puVar1 + vVar2;
            pvVar6 = vector<unsigned_long,_true>::operator[](this_02,local_58 + 0x20);
            uVar25 = *pvVar6 - vVar2;
            if (uVar25 != 0 && (long)vVar2 <= (long)*pvVar6) {
              do {
                uVar16 = uVar25 >> 1;
                uVar26 = ~uVar16 + uVar25;
                uVar25 = uVar16;
                if (puVar20[uVar16] < uVar24) {
                  puVar20 = puVar20 + uVar16 + 1;
                  uVar25 = uVar26;
                }
              } while (0 < (long)uVar25);
            }
            uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar20 - (long)puVar1 >> 3);
            local_58 = (lower / local_88) * 0x40 + (uVar9 & 0xffffffffffffffe0);
          }
          for (; local_88 <= upper - uVar14; uVar14 = uVar14 + local_88) {
            pvVar6 = vector<unsigned_long,_true>::operator[](this_02,__n);
            vVar2 = *pvVar6;
            puVar20 = puVar1 + vVar2;
            pvVar6 = vector<unsigned_long,_true>::operator[](this_02,__n + 0x20);
            uVar25 = *pvVar6 - vVar2;
            if (uVar25 != 0 && (long)vVar2 <= (long)*pvVar6) {
              do {
                uVar16 = uVar25 >> 1;
                uVar26 = ~uVar16 + uVar25;
                uVar25 = uVar16;
                if (puVar20[uVar16] < uVar24) {
                  puVar20 = puVar20 + uVar16 + 1;
                  uVar25 = uVar26;
                }
              } while (0 < (long)uVar25);
            }
            uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar20 - (long)puVar1 >> 3);
            iVar29 = iVar29 + (uVar9 - uVar14);
            __n = __n + 1;
          }
          if (uVar14 != upper) {
            pvVar6 = vector<unsigned_long,_true>::operator[](this_02,__n);
            vVar2 = *pvVar6;
            puVar20 = puVar1 + vVar2;
            pvVar6 = vector<unsigned_long,_true>::operator[](this_02,__n + 0x20);
            uVar25 = *pvVar6 - vVar2;
            if (uVar25 != 0 && (long)vVar2 <= (long)*pvVar6) {
              do {
                uVar16 = uVar25 >> 1;
                uVar26 = ~uVar16 + uVar25;
                uVar25 = uVar16;
                if (puVar20[uVar16] < uVar24) {
                  puVar20 = puVar20 + uVar16 + 1;
                  uVar25 = uVar26;
                }
              } while (0 < (long)uVar25);
            }
            uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar20 - (long)puVar1 >> 3);
            __n = (upper / local_88) * 0x40 + (uVar9 & 0xffffffffffffffe0);
          }
          bVar4 = 2 < uVar11;
          uVar11 = sVar18;
        } while (bVar4);
      }
      if (1 < sVar18) {
        sVar18 = sVar18 - 1;
        do {
          uVar25 = local_88 >> 5;
          pvVar5 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                   ::operator[](&this_00->tree,sVar18);
          puVar1 = (pvVar5->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = local_98 - lower;
          while (uVar25 <= uVar11) {
            puVar20 = puVar1 + (local_98 - uVar25);
            uVar11 = uVar25;
            puVar19 = puVar20;
            if (0x1f < local_88) {
              do {
                uVar16 = uVar11 >> 1;
                if (puVar19[uVar16] < uVar24) {
                  puVar19 = puVar19 + uVar16 + 1;
                  uVar16 = ~uVar16 + uVar11;
                }
                uVar11 = uVar16;
              } while (0 < (long)uVar16);
            }
            uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar19 - (long)puVar1 >> 3);
            uVar12 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar20 - (long)puVar1 >> 3);
            iVar29 = iVar29 + (uVar9 - uVar12);
            local_98 = local_98 - uVar25;
            uVar11 = local_98 - lower;
          }
          for (; uVar25 <= upper - uVar14; uVar14 = uVar14 + uVar25) {
            puVar20 = puVar1 + uVar14;
            uVar11 = uVar25;
            do {
              uVar16 = uVar11 >> 1;
              uVar26 = ~uVar16 + uVar11;
              uVar11 = uVar16;
              if (puVar20[uVar16] < uVar24) {
                puVar20 = puVar20 + uVar16 + 1;
                uVar11 = uVar26;
              }
            } while (0 < (long)uVar11);
            uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)puVar20 - (long)puVar1 >> 3);
            uVar12 = NumericCastImpl<unsigned_long,_long,_false>::Convert(uVar14);
            iVar29 = iVar29 + (uVar9 - uVar12);
          }
          sVar18 = sVar18 - 1;
          local_88 = uVar25;
        } while (sVar18 != 0);
      }
      pvVar5 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::operator[](&this_00->tree,0);
      puVar1 = (pvVar5->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_98 != lower) {
        do {
          iVar29 = iVar29 + (puVar1[lower] < uVar24);
          lower = lower + 1;
        } while (local_98 != lower);
      }
      for (; lower = iVar29, uVar14 != upper; uVar14 = uVar14 + 1) {
        puVar20 = puVar1 + uVar14;
        iVar29 = lower + (*puVar20 < uVar24);
      }
    }
  }
  return lower;
}

Assistant:

idx_t WindowTokenTree::PeerEnd(const idx_t lower, const idx_t upper, const idx_t row_idx) const {
	if (mst64) {
		return NextPeer(*mst64, lower, upper, row_idx);
	} else {
		return NextPeer(*mst32, lower, upper, row_idx);
	}
}